

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  int iVar1;
  Message *pMVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->prototypes_mutex_);
  if (iVar1 == 0) {
    pMVar2 = GetPrototypeNoLock(this,type);
    pthread_mutex_unlock((pthread_mutex_t *)&this->prototypes_mutex_);
    return pMVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}